

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cstring.cpp
# Opt level: O0

char * uprv_strndup_63(char *src,int32_t n)

{
  char *local_20;
  char *dup;
  int32_t n_local;
  char *src_local;
  
  if (n < 0) {
    local_20 = uprv_strdup_63(src);
  }
  else {
    local_20 = (char *)uprv_malloc_63((long)(n + 1));
    if (local_20 != (char *)0x0) {
      memcpy(local_20,src,(long)n);
      local_20[n] = '\0';
    }
  }
  return local_20;
}

Assistant:

U_CAPI char* U_EXPORT2
uprv_strndup(const char *src, int32_t n) {
    char *dup;

    if(n < 0) {
        dup = uprv_strdup(src);
    } else {
        dup = (char*)uprv_malloc(n+1);
        if (dup) { 
            uprv_memcpy(dup, src, n);
            dup[n] = 0;
        }
    }

    return dup;
}